

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btDiscreteDynamicsWorld::removeConstraint
          (btDiscreteDynamicsWorld *this,btTypedConstraint *constraint)

{
  btTypedConstraint *in_RSI;
  long in_RDI;
  btTypedConstraint *local_10 [2];
  
  local_10[0] = in_RSI;
  btAlignedObjectArray<btTypedConstraint_*>::remove
            ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x120),(char *)local_10);
  btTypedConstraint::getRigidBodyA(local_10[0]);
  btRigidBody::removeConstraintRef((btRigidBody *)this,constraint);
  btTypedConstraint::getRigidBodyB(local_10[0]);
  btRigidBody::removeConstraintRef((btRigidBody *)this,constraint);
  return;
}

Assistant:

void	btDiscreteDynamicsWorld::removeConstraint(btTypedConstraint* constraint)
{
	m_constraints.remove(constraint);
	constraint->getRigidBodyA().removeConstraintRef(constraint);
	constraint->getRigidBodyB().removeConstraintRef(constraint);
}